

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_5uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  
  for (uVar16 = 0; uVar16 < (length & 0xfffffffffffffff8); uVar16 = uVar16 + 8) {
    bVar1 = *pSrc;
    bVar2 = pSrc[1];
    bVar3 = pSrc[2];
    bVar4 = pSrc[3];
    bVar5 = pSrc[4];
    pSrc = pSrc + 5;
    pDst[uVar16] = (uint)(bVar1 >> 3);
    pDst[uVar16 + 1] = (uint)(bVar2 >> 6) + (bVar1 & 7) * 4;
    pDst[uVar16 + 2] = bVar2 >> 1 & 0x1f;
    pDst[uVar16 + 3] = (uint)(bVar3 >> 4) | (bVar2 & 1) << 4;
    pDst[uVar16 + 4] = (uint)(bVar4 >> 7) + (bVar3 & 0xf) * 2;
    pDst[uVar16 + 5] = bVar4 >> 2 & 0x1f;
    pDst[uVar16 + 6] = (uint)(bVar5 >> 5) + (bVar4 & 3) * 8;
    pDst[uVar16 + 7] = bVar5 & 0x1f;
  }
  if ((length & 7) != 0) {
    bVar1 = *pSrc;
    pDst[uVar16] = (uint)(bVar1 >> 3);
    uVar15 = (uint)(length & 7);
    if (uVar15 != 1) {
      uVar10 = 0;
      uVar17 = 3;
      uVar11 = 5;
      while( true ) {
        uVar9 = (uint)bVar1;
        pbVar12 = pSrc + 1;
        uVar13 = uVar11 - uVar17;
        if (uVar11 < uVar17 || uVar13 == 0) break;
        uVar10 = (uVar10 | uVar9 & ~(-1 << (sbyte)uVar17)) << ((byte)uVar13 & 0x1f);
        bVar1 = *pbVar12;
        uVar17 = 8;
        pSrc = pbVar12;
        uVar11 = uVar13;
      }
      iVar6 = uVar17 - uVar11;
      pDst[uVar16 + 1] =
           ~(-1 << ((byte)uVar11 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar6 & 0x1f)) | uVar10;
      if (2 < uVar15) {
        if (iVar6 == 0) {
          pbVar7 = pSrc + 2;
          uVar11 = 0;
          iVar14 = 5;
          goto LAB_0010e0c9;
        }
        uVar11 = 0;
        iVar8 = 5;
        while (iVar14 = iVar8 - iVar6, iVar14 != 0 && iVar6 <= iVar8) {
          uVar11 = (uVar11 | uVar9 & ~(-1 << ((byte)iVar6 & 0x1f))) << ((byte)iVar14 & 0x1f);
          pbVar7 = pbVar12 + 1;
LAB_0010e0c9:
          uVar9 = (uint)*pbVar12;
          pbVar12 = pbVar7;
          iVar8 = iVar14;
          iVar6 = 8;
        }
        iVar6 = iVar6 - iVar8;
        pDst[uVar16 + 2] = ~(-1 << ((byte)iVar8 & 0x1f)) & uVar9 >> ((byte)iVar6 & 0x1f) | uVar11;
        if (uVar15 != 3) {
          uVar11 = 0;
          iVar8 = 5;
          iVar14 = 5;
          if (iVar6 != 0) goto LAB_0010e13f;
          while( true ) {
            iVar8 = iVar14;
            uVar9 = (uint)*pbVar12;
            pbVar12 = pbVar12 + 1;
            iVar6 = 8;
LAB_0010e13f:
            iVar14 = iVar8 - iVar6;
            if (iVar14 == 0 || iVar8 < iVar6) break;
            uVar11 = (uVar11 | uVar9 & ~(-1 << ((byte)iVar6 & 0x1f))) << ((byte)iVar14 & 0x1f);
          }
          iVar6 = iVar6 - iVar8;
          pDst[uVar16 + 3] = ~(-1 << ((byte)iVar8 & 0x1f)) & uVar9 >> ((byte)iVar6 & 0x1f) | uVar11;
          if (4 < uVar15) {
            uVar11 = 0;
            iVar8 = 5;
            iVar14 = 5;
            if (iVar6 != 0) goto LAB_0010e1a3;
            while( true ) {
              iVar8 = iVar14;
              uVar9 = (uint)*pbVar12;
              pbVar12 = pbVar12 + 1;
              iVar6 = 8;
LAB_0010e1a3:
              iVar14 = iVar8 - iVar6;
              if (iVar14 == 0 || iVar8 < iVar6) break;
              uVar11 = (uVar11 | uVar9 & ~(-1 << ((byte)iVar6 & 0x1f))) << ((byte)iVar14 & 0x1f);
            }
            iVar6 = iVar6 - iVar8;
            pDst[uVar16 + 4] =
                 ~(-1 << ((byte)iVar8 & 0x1f)) & uVar9 >> ((byte)iVar6 & 0x1f) | uVar11;
            if (uVar15 != 5) {
              uVar11 = 0;
              iVar8 = 5;
              iVar14 = 5;
              if (iVar6 != 0) goto LAB_0010e207;
              while( true ) {
                iVar8 = iVar14;
                uVar9 = (uint)*pbVar12;
                pbVar12 = pbVar12 + 1;
                iVar6 = 8;
LAB_0010e207:
                iVar14 = iVar8 - iVar6;
                if (iVar14 == 0 || iVar8 < iVar6) break;
                uVar11 = (uVar11 | uVar9 & ~(-1 << ((byte)iVar6 & 0x1f))) << ((byte)iVar14 & 0x1f);
              }
              iVar6 = iVar6 - iVar8;
              pDst[uVar16 + 5] =
                   ~(-1 << ((byte)iVar8 & 0x1f)) & uVar9 >> ((byte)iVar6 & 0x1f) | uVar11;
              if (uVar15 == 7) {
                uVar15 = 0;
                iVar8 = 5;
                iVar14 = 5;
                if (iVar6 != 0) goto LAB_0010e267;
                while( true ) {
                  iVar8 = iVar14;
                  uVar9 = (uint)*pbVar12;
                  pbVar12 = pbVar12 + 1;
                  iVar6 = 8;
LAB_0010e267:
                  iVar14 = iVar8 - iVar6;
                  if (iVar14 == 0 || iVar8 < iVar6) break;
                  uVar15 = (uVar15 | uVar9 & ~(-1 << ((byte)iVar6 & 0x1f))) << ((byte)iVar14 & 0x1f)
                  ;
                }
                pDst[uVar16 + 6] =
                     ~(-1 << ((byte)iVar8 & 0x1f)) & uVar9 >> ((byte)iVar6 - (byte)iVar8 & 0x1f) |
                     uVar15;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_5uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val0 & 0x7U) << 2) | (val1 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val1 & 0x3FU) >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val1 & 0x1U) << 4) | (val2 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val2 & 0xFU) << 1) | (val3 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val3 & 0x7FU) >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val3 & 0x3U) << 3) | (val4 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val4 & 0x1FU)));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 5)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 5)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 5)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 5)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 5)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 5)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 5)
                            }
                        }
                    }
                }
            }
        }
    }
}